

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O2

QAbstractItemModel * createTreeModel(QObject *parent)

{
  int iVar1;
  int iVar2;
  int iVar3;
  QStandardItemModel *this;
  int a;
  anon_union_24_3_e3d07ef4_for_data local_f8;
  QArrayDataPointer<char16_t> local_d8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_90;
  QArrayDataPointer<char16_t> local_78;
  QModelIndex parIdx;
  QArrayDataPointer<char16_t> local_48;
  
  this = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this,parent);
  local_f8._forAlignment = -NAN;
  local_f8._8_8_ = 0;
  local_f8._16_8_ = 0;
  a = 0;
  (**(code **)(*(long *)this + 0xf8))(this,0,5,&local_f8);
  local_f8._forAlignment = -NAN;
  local_f8._8_8_ = 0;
  local_f8._16_8_ = 0;
  (**(code **)(*(long *)this + 0x100))(this,0,3,&local_f8);
  while( true ) {
    local_f8._forAlignment = -NAN;
    local_f8._8_8_ = 0;
    local_f8._16_8_ = 0;
    iVar1 = (**(code **)(*(long *)this + 0x78))();
    if (iVar1 <= a) break;
    iVar1 = 0;
    while( true ) {
      local_f8._forAlignment = -NAN;
      local_f8._8_8_ = 0;
      local_f8._16_8_ = 0;
      iVar2 = (**(code **)(*(long *)this + 0x80))(this);
      if (iVar2 <= iVar1) break;
      local_c0 = 0xffffffffffffffff;
      local_b8 = 0;
      uStack_b0 = 0;
      (**(code **)(*(long *)this + 0x60))(&parIdx,this,a,iVar1,&local_c0);
      local_a8.d = (Data *)0x0;
      local_a8.ptr = L"%1,%2";
      local_a8.size = 5;
      local_d8.d = (Data *)0x0;
      local_d8.ptr = (char16_t *)0x0;
      local_d8.size = 0;
      QString::arg((QString *)&local_90,(QString *)&local_a8,a,0,10,(QChar)0x20);
      QString::arg((QString *)&local_78,(QString *)&local_90,iVar1,0,10,(QChar)0x20);
      QVariant::QVariant((QVariant *)&local_f8,(QString *)&local_78);
      (**(code **)(*(long *)this + 0x98))(this,&parIdx,&local_f8,2);
      QVariant::~QVariant((QVariant *)&local_f8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
      local_c0 = 0xffffffffffffffff;
      local_b8 = 0;
      uStack_b0 = 0;
      (**(code **)(*(long *)this + 0x60))(&parIdx,this,a,iVar1,&local_c0);
      QVariant::QVariant((QVariant *)&local_f8,a);
      (**(code **)(*(long *)this + 0x98))(this,&parIdx,&local_f8,0x100);
      QVariant::~QVariant((QVariant *)&local_f8);
      local_c0 = 0xffffffffffffffff;
      local_b8 = 0;
      uStack_b0 = 0;
      (**(code **)(*(long *)this + 0x60))(&parIdx,this,a,iVar1,&local_c0);
      QVariant::QVariant((QVariant *)&local_f8,iVar1);
      (**(code **)(*(long *)this + 0x98))(this,&parIdx,&local_f8);
      QVariant::~QVariant((QVariant *)&local_f8);
      iVar1 = iVar1 + 1;
    }
    local_f8._forAlignment = -NAN;
    local_f8._8_8_ = 0;
    local_f8._16_8_ = 0;
    iVar1 = 0;
    (**(code **)(*(long *)this + 0x60))(&parIdx,this,a,0);
    (**(code **)(*(long *)this + 0xf8))(this,0,5,&parIdx);
    (**(code **)(*(long *)this + 0x100))(this,0,3);
    while( true ) {
      iVar2 = (**(code **)(*(long *)this + 0x78))(this,&parIdx);
      if (iVar2 <= iVar1) break;
      iVar2 = 0;
      while( true ) {
        iVar3 = (**(code **)(*(long *)this + 0x80))(this,&parIdx);
        if (iVar3 <= iVar2) break;
        (**(code **)(*(long *)this + 0x60))(&local_c0,this,iVar1,iVar2,&parIdx);
        local_d8.d = (Data *)0x0;
        local_d8.ptr = L"%1,%2,%3";
        local_d8.size = 8;
        local_48.d = (Data *)0x0;
        local_48.ptr = (char16_t *)0x0;
        local_48.size = 0;
        QString::arg((QString *)&local_a8,(QString *)&local_d8,a,0,10,(QChar)0x20);
        QString::arg((QString *)&local_90,(QString *)&local_a8,iVar1,0,10,(QChar)0x20);
        QString::arg((QString *)&local_78,(QString *)&local_90,iVar2,0,10,(QChar)0x20);
        QVariant::QVariant((QVariant *)&local_f8,(QString *)&local_78);
        (**(code **)(*(long *)this + 0x98))(this,&local_c0,&local_f8,2);
        QVariant::~QVariant((QVariant *)&local_f8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_90);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
        (**(code **)(*(long *)this + 0x60))(&local_c0,this,iVar1,iVar2,&parIdx);
        QVariant::QVariant((QVariant *)&local_f8,iVar2);
        (**(code **)(*(long *)this + 0x98))(this,&local_c0,&local_f8,0x100);
        QVariant::~QVariant((QVariant *)&local_f8);
        (**(code **)(*(long *)this + 0x60))(&local_c0,this,iVar1,iVar2,&parIdx);
        QVariant::QVariant((QVariant *)&local_f8,iVar1);
        (**(code **)(*(long *)this + 0x98))(this,&local_c0,&local_f8);
        QVariant::~QVariant((QVariant *)&local_f8);
        iVar2 = iVar2 + 1;
      }
      iVar1 = iVar1 + 1;
    }
    a = a + 1;
  }
  return (QAbstractItemModel *)this;
}

Assistant:

QAbstractItemModel *createTreeModel(QObject *parent)
{
    QAbstractItemModel *result = nullptr;
#ifdef COMPLEX_MODEL_SUPPORT
    result = new ComplexModel(parent);
    result->insertRows(0, 5);
    result->insertColumns(0, 3);
    for (int i = 0; i < result->rowCount(); ++i) {
        for (int j = 0; j < result->columnCount(); ++j) {
            result->setData(result->index(i, j), QStringLiteral("%1,%2").arg(i).arg(j), Qt::EditRole);
            result->setData(result->index(i, j), i, Qt::UserRole);
            result->setData(result->index(i, j), j, Qt::UserRole + 1);
        }
        const QModelIndex parIdx = result->index(i, 0);
        result->insertRows(0, 5, parIdx);
        result->insertColumns(0, 3, parIdx);
        for (int k = 0; k < result->rowCount(parIdx); ++k) {
            for (int h = 0; h < result->columnCount(parIdx); ++h) {
                result->setData(result->index(k, h, parIdx), QStringLiteral("%1,%2,%3").arg(i).arg(k).arg(h), Qt::EditRole);
                result->setData(result->index(k, h, parIdx), h, Qt::UserRole);
                result->setData(result->index(k, h, parIdx), k, Qt::UserRole + 1);
            }
        }
    }
#endif
    return result;
}